

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O3

bool anon_unknown.dwarf_165f3fd::TestPresetOutputTruncationHelper
               (optional<cmCTestTypes::TruncationMode> *out,Value *value,cmJSONState *state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  _Optional_payload_base<cmCTestTypes::TruncationMode> _Var4;
  String local_50;
  
  if (value == (Value *)0x0) {
    if ((out->super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>)._M_payload.
        super__Optional_payload_base<cmCTestTypes::TruncationMode>._M_engaged != true) {
      return true;
    }
    (out->super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>)._M_payload.
    super__Optional_payload_base<cmCTestTypes::TruncationMode>._M_engaged = false;
    return true;
  }
  bVar2 = Json::Value::isString(value);
  if (bVar2) {
    Json::Value::asString_abi_cxx11_(&local_50,value);
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    paVar1 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 == 0) {
      _Var4._M_payload = (_Storage<cmCTestTypes::TruncationMode,_true>)0x0;
      _Var4._M_engaged = true;
      _Var4._5_3_ = 0;
    }
    else {
      Json::Value::asString_abi_cxx11_(&local_50,value);
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        _Var4._M_payload = (_Storage<cmCTestTypes::TruncationMode,_true>)0x1;
        _Var4._M_engaged = true;
        _Var4._5_3_ = 0;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_50,value);
        iVar3 = std::__cxx11::string::compare((char *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 != 0) goto LAB_003e7ded;
        _Var4._M_payload = (_Storage<cmCTestTypes::TruncationMode,_true>)0x2;
        _Var4._M_engaged = true;
        _Var4._5_3_ = 0;
      }
    }
    (out->super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>)._M_payload.
    super__Optional_payload_base<cmCTestTypes::TruncationMode> = _Var4;
    bVar2 = true;
  }
  else {
LAB_003e7ded:
    cmCMakePresetsErrors::INVALID_PRESET(value,state);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool TestPresetOutputTruncationHelper(
  cm::optional<cmCTestTypes::TruncationMode>& out, const Json::Value* value,
  cmJSONState* state)
{
  if (!value) {
    out = cm::nullopt;
    return true;
  }

  if (!value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "tail") {
    out = cmCTestTypes::TruncationMode::Tail;
    return true;
  }

  if (value->asString() == "middle") {
    out = cmCTestTypes::TruncationMode::Middle;
    return true;
  }

  if (value->asString() == "head") {
    out = cmCTestTypes::TruncationMode::Head;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}